

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
          (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this,
          TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *o)

{
  Node *pNVar1;
  hash_t hVar2;
  
  this->NumUsed = 0;
  ClearNodeVector(this);
  pNVar1 = o->LastFree;
  this->Nodes = o->Nodes;
  this->LastFree = pNVar1;
  hVar2 = o->NumUsed;
  this->Size = o->Size;
  this->NumUsed = hVar2;
  o->Size = 0;
  o->NumUsed = 0;
  o->Nodes = (Node *)0x0;
  o->LastFree = (Node *)0x0;
  SetNodeVector(o,1);
  return;
}

Assistant:

void TransferFrom(TMap &o)
	{
		// Clear all our nodes.
		NumUsed = 0;
		ClearNodeVector();

		// Copy all of o's nodes.
		Nodes = o.Nodes;
		LastFree = o.LastFree;
		Size = o.Size;
		NumUsed = o.NumUsed;

		// Tell o it doesn't have any nodes.
		o.Nodes = NULL;
		o.Size = 0;
		o.LastFree = NULL;
		o.NumUsed = 0;

		// Leave o functional with one empty node.
		o.SetNodeVector(1);
	}